

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void SplitUVPlane(uint8_t *src_uv,int src_stride_uv,uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,
                 int dst_stride_v,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SplitUVRow;
  int y;
  code *local_38;
  int local_30;
  long local_28;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_38 = SplitUVRow_C;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  if ((int)dst_v < 0) {
    dst_v._0_4_ = -(int)dst_v;
    local_18 = in_RDX + ((int)dst_v + -1) * in_ECX;
    local_28 = in_R8 + ((int)dst_v + -1) * in_R9D;
    local_1c = -in_ECX;
    in_R9D = -in_R9D;
  }
  local_c = in_ESI;
  if (((in_ESI == y * 2) && (local_1c == y)) && (in_R9D == y)) {
    y = (int)dst_v * y;
    dst_v._0_4_ = 1;
    in_R9D = 0;
    local_1c = 0;
    local_c = 0;
  }
  iVar1 = libyuv::TestCpuFlag(in_R9D);
  if ((iVar1 != 0) && (local_38 = SplitUVRow_Any_SSE2, (y & 0xfU) == 0)) {
    local_38 = SplitUVRow_SSE2;
  }
  iVar1 = libyuv::TestCpuFlag(in_R9D);
  if ((iVar1 != 0) && (local_38 = SplitUVRow_Any_AVX2, (y & 0x1fU) == 0)) {
    local_38 = SplitUVRow_AVX2;
  }
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < (int)dst_v; local_30 = local_30 + 1) {
    (*local_38)(local_8,local_18,local_28,y);
    local_18 = local_18 + local_1c;
    local_28 = local_28 + in_R9D;
    local_8 = local_8 + local_c;
  }
  return;
}

Assistant:

LIBYUV_API
void SplitUVPlane(const uint8_t* src_uv,
                  int src_stride_uv,
                  uint8_t* dst_u,
                  int dst_stride_u,
                  uint8_t* dst_v,
                  int dst_stride_v,
                  int width,
                  int height) {
  int y;
  void (*SplitUVRow)(const uint8_t* src_uv, uint8_t* dst_u, uint8_t* dst_v,
                     int width) = SplitUVRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_u = dst_u + (height - 1) * dst_stride_u;
    dst_v = dst_v + (height - 1) * dst_stride_v;
    dst_stride_u = -dst_stride_u;
    dst_stride_v = -dst_stride_v;
  }
  // Coalesce rows.
  if (src_stride_uv == width * 2 && dst_stride_u == width &&
      dst_stride_v == width) {
    width *= height;
    height = 1;
    src_stride_uv = dst_stride_u = dst_stride_v = 0;
  }
#if defined(HAS_SPLITUVROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SplitUVRow = SplitUVRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_SSE2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    SplitUVRow = SplitUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SplitUVRow = SplitUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_NEON;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SplitUVRow = SplitUVRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      SplitUVRow = SplitUVRow_MMI;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SplitUVRow = SplitUVRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    // Copy a row of UV.
    SplitUVRow(src_uv, dst_u, dst_v, width);
    dst_u += dst_stride_u;
    dst_v += dst_stride_v;
    src_uv += src_stride_uv;
  }
}